

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trw.cpp
# Opt level: O1

Factor * __thiscall libDAI::TRW::beliefF(Factor *__return_storage_ptr__,TRW *this,size_t I)

{
  size_t sVar1;
  pointer pTVar2;
  undefined1 auVar3 [16];
  Factor *pFVar4;
  int iVar5;
  undefined4 extraout_var;
  vector<libDAI::Var,_std::allocator<libDAI::Var>_> *pvVar6;
  undefined4 extraout_var_00;
  pointer pcVar7;
  undefined4 extraout_var_01;
  size_type sVar8;
  undefined4 extraout_var_02;
  TFactor<double> *this_00;
  const_iterator cVar9;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long *plVar10;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  pointer pVVar11;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  Exception *pEVar12;
  long lVar13;
  long lVar14;
  size_t *psVar15;
  long lVar16;
  undefined1 in_XMM2 [16];
  Var v_j;
  VarSet v_J;
  Var v_i;
  Var v_i_1;
  VarSet v_I;
  Factor prod;
  Var v_k;
  long *local_180;
  string local_178;
  TProb<double> local_158;
  undefined1 local_138 [32];
  pointer local_118;
  pointer local_108;
  size_t local_100;
  VarSet local_f8;
  WeightedGraph<double> *local_d0;
  Var local_c8;
  Factor *local_b0;
  long local_a8;
  VarSet local_a0;
  TFactor<double> local_80;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_b0 = __return_storage_ptr__;
  iVar5 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
  local_100 = I;
  pvVar6 = (vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)
           (**(code **)(*(long *)CONCAT44(extraout_var,iVar5) + 0x50))
                     ((long *)CONCAT44(extraout_var,iVar5),I);
  std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::vector(&local_a0._vars,pvVar6);
  local_a0._statespace =
       (size_t)pvVar6[1].super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
               super__Vector_impl_data._M_start;
  TFactor<double>::TFactor(&local_80);
  lVar13 = (long)local_a0._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)local_a0._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 4;
  if (lVar13 != 1) {
    if (lVar13 != 2) {
      pEVar12 = (Exception *)__cxa_allocate_exception(0x10);
      local_138._0_8_ = local_138 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"trw.cpp, line 575","");
      Exception::Exception(pEVar12,0,(string *)local_138);
      __cxa_throw(pEVar12,&Exception::typeinfo,std::runtime_error::~runtime_error);
    }
    local_f8._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)(local_a0._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                   _M_impl.super__Vector_impl_data._M_start)->_label;
    local_f8._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)(local_a0._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                   _M_impl.super__Vector_impl_data._M_start)->_states;
    VarSet::VarSet((VarSet *)&local_178,(Var *)&local_f8);
    VarSet::operator/((VarSet *)local_138,&local_a0,(VarSet *)&local_178);
    local_158._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_start = *(pointer *)local_138._0_8_;
    local_158._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_finish = *(pointer *)(local_138._0_8_ + 8);
    if ((pointer)local_138._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_138._0_8_,local_138._16_8_ - local_138._0_8_);
    }
    if (local_178._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_178._M_dataplus._M_p,
                      local_178.field_2._M_allocated_capacity - (long)local_178._M_dataplus._M_p);
    }
    iVar5 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    pcVar7 = (pointer)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar5) + 0x40))
                                ((long *)CONCAT44(extraout_var_00,iVar5),&local_f8);
    iVar5 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    sVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar5) + 0x40))
                      ((long *)CONCAT44(extraout_var_01,iVar5),&local_158);
    iVar5 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    this_00 = (TFactor<double> *)
              (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar5) + 0x50))
                        ((long *)CONCAT44(extraout_var_02,iVar5),local_100);
    local_178._M_dataplus._M_p = pcVar7;
    local_178._M_string_length = sVar8;
    cVar9 = std::
            _Rb_tree<libDAI::UEdge,_std::pair<const_libDAI::UEdge,_double>,_std::_Select1st<std::pair<const_libDAI::UEdge,_double>_>,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
            ::find((_Rb_tree<libDAI::UEdge,_std::pair<const_libDAI::UEdge,_double>,_std::_Select1st<std::pair<const_libDAI::UEdge,_double>_>,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
                    *)&this->_rho_e,(key_type *)&local_178);
    TFactor<double>::operator^
              ((TFactor<double> *)local_138,this_00,1.0 / (double)cVar9._M_node[1]._M_left);
    TFactor<double>::operator=(&local_80,(TFactor<double> *)local_138);
    if (local_118 != (pointer)0x0) {
      operator_delete(local_118,(long)local_108 - (long)local_118);
    }
    if ((pointer)local_138._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_138._0_8_,local_138._16_8_ - local_138._0_8_);
    }
  }
  iVar5 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
  local_a8 = local_100 * 3;
  local_180 = *(long **)(*(long *)(CONCAT44(extraout_var_03,iVar5) + 0x88) + local_100 * 0x18);
  local_d0 = &this->_rho_e;
  do {
    iVar5 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    pFVar4 = local_b0;
    if (local_180 ==
        *(long **)(*(long *)(CONCAT44(extraout_var_04,iVar5) + 0x88) + 8 + local_a8 * 8)) {
      TFactor<double>::normalized(local_b0,&local_80,NORMPROB);
      if (local_80._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_80._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_80._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_80._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_80._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_80._vs._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_80._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_80._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_a0._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_a0._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return pFVar4;
    }
    iVar5 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    plVar10 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_05,iVar5) + 0x30))
                                ((long *)CONCAT44(extraout_var_05,iVar5),*local_180);
    local_c8._label = *plVar10;
    local_c8._states = plVar10[1];
    auVar3 = vcvtusi2sd_avx512f(in_XMM2,local_c8._states);
    local_138._0_8_ = 1.0 / auVar3._0_8_;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_158._p,local_c8._states,(value_type_conflict3 *)local_138,
               (allocator_type *)&local_178);
    iVar5 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    psVar15 = *(size_t **)(*(long *)(CONCAT44(extraout_var_06,iVar5) + 0x70) + *local_180 * 0x18);
    while( true ) {
      iVar5 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      if (psVar15 ==
          *(size_t **)(*(long *)(CONCAT44(extraout_var_07,iVar5) + 0x70) + 8 + *local_180 * 0x18))
      break;
      iVar5 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      pvVar6 = (vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)
               (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar5) + 0x50))
                         ((long *)CONCAT44(extraout_var_08,iVar5),*psVar15);
      std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::vector
                ((vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)local_138,pvVar6);
      local_138._24_8_ =
           pvVar6[1].super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
           super__Vector_impl_data._M_start;
      lVar13 = (long)(local_138._8_8_ - local_138._0_8_) >> 4;
      if (lVar13 == 2) {
        VarSet::VarSet(&local_f8,&local_c8);
        VarSet::operator/((VarSet *)&local_178,(VarSet *)local_138,&local_f8);
        local_48 = *(undefined8 *)local_178._M_dataplus._M_p;
        uStack_40 = *(undefined8 *)(local_178._M_dataplus._M_p + 8);
        if (local_178._M_dataplus._M_p != (pointer)0x0) {
          operator_delete(local_178._M_dataplus._M_p,
                          local_178.field_2._M_allocated_capacity - (long)local_178._M_dataplus._M_p
                         );
        }
        if (local_f8._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_f8._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_f8._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_f8._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        iVar5 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this)
        ;
        pVVar11 = (pointer)(**(code **)(*(long *)CONCAT44(extraout_var_10,iVar5) + 0x40))
                                     ((long *)CONCAT44(extraout_var_10,iVar5),&local_48);
        if (*psVar15 == local_100) {
          lVar13 = *local_180;
          sVar1 = *psVar15;
          iVar5 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])
                            (this);
          lVar13 = *(long *)(*(long *)(*(long *)(CONCAT44(extraout_var_11,iVar5) + 0x58) +
                                      lVar13 * 0x18) + sVar1 * 8);
          pTVar2 = (this->_newmessages).
                   super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_f8._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)*local_180;
          local_f8._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_finish = pVVar11;
          cVar9 = std::
                  _Rb_tree<libDAI::UEdge,_std::pair<const_libDAI::UEdge,_double>,_std::_Select1st<std::pair<const_libDAI::UEdge,_double>_>,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
                  ::find((_Rb_tree<libDAI::UEdge,_std::pair<const_libDAI::UEdge,_double>,_std::_Select1st<std::pair<const_libDAI::UEdge,_double>_>,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
                          *)local_d0,(key_type *)&local_f8);
          TProb<double>::operator^
                    ((TProb<double> *)&local_178,pTVar2 + lVar13,
                     (double)cVar9._M_node[1]._M_left + -1.0);
          if ((long)local_158._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_158._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start != 0) {
            lVar13 = (long)local_158._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_158._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3;
            lVar14 = 0;
            do {
              local_158._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar14] =
                   *(double *)(local_178._M_dataplus._M_p + lVar14 * 8) *
                   local_158._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar14];
              lVar14 = lVar14 + 1;
            } while (lVar13 + (ulong)(lVar13 == 0) != lVar14);
          }
        }
        else {
          lVar13 = *local_180;
          sVar1 = *psVar15;
          iVar5 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])
                            (this);
          lVar13 = *(long *)(*(long *)(*(long *)(CONCAT44(extraout_var_12,iVar5) + 0x58) +
                                      lVar13 * 0x18) + sVar1 * 8);
          pTVar2 = (this->_newmessages).
                   super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_f8._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)*local_180;
          local_f8._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_finish = pVVar11;
          cVar9 = std::
                  _Rb_tree<libDAI::UEdge,_std::pair<const_libDAI::UEdge,_double>,_std::_Select1st<std::pair<const_libDAI::UEdge,_double>_>,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
                  ::find((_Rb_tree<libDAI::UEdge,_std::pair<const_libDAI::UEdge,_double>,_std::_Select1st<std::pair<const_libDAI::UEdge,_double>_>,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
                          *)local_d0,(key_type *)&local_f8);
          TProb<double>::operator^
                    ((TProb<double> *)&local_178,pTVar2 + lVar13,(Real)cVar9._M_node[1]._M_left);
          if ((long)local_158._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_158._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start != 0) {
            lVar13 = (long)local_158._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_158._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3;
            lVar14 = 0;
            do {
              local_158._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar14] =
                   *(double *)(local_178._M_dataplus._M_p + lVar14 * 8) *
                   local_158._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar14];
              lVar14 = lVar14 + 1;
            } while (lVar13 + (ulong)(lVar13 == 0) != lVar14);
          }
        }
        if (local_178._M_dataplus._M_p != (pointer)0x0) {
          operator_delete(local_178._M_dataplus._M_p,
                          local_178.field_2._M_allocated_capacity - (long)local_178._M_dataplus._M_p
                         );
        }
      }
      else {
        if (lVar13 != 1) {
          pEVar12 = (Exception *)__cxa_allocate_exception(0x10);
          local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_178,"trw.cpp, line 593","");
          Exception::Exception(pEVar12,0,&local_178);
          __cxa_throw(pEVar12,&Exception::typeinfo,std::runtime_error::~runtime_error);
        }
        lVar13 = *local_180;
        sVar1 = *psVar15;
        iVar5 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this)
        ;
        if ((long)local_158._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_158._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start != 0) {
          lVar14 = (long)local_158._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_158._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3;
          lVar13 = *(long *)&(this->_newmessages).
                             super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start
                             [*(long *)(*(long *)(*(long *)(CONCAT44(extraout_var_09,iVar5) + 0x58)
                                                 + lVar13 * 0x18) + sVar1 * 8)]._p.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl;
          lVar16 = 0;
          do {
            local_158._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar16] =
                 *(double *)(lVar13 + lVar16 * 8) *
                 local_158._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar16];
            lVar16 = lVar16 + 1;
          } while (lVar14 + (ulong)(lVar14 == 0) != lVar16);
        }
      }
      if ((pointer)local_138._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_138._0_8_,local_138._16_8_ - local_138._0_8_);
      }
      psVar15 = psVar15 + 1;
    }
    VarSet::VarSet((VarSet *)&local_178,&local_c8);
    TFactor<double>::TFactor((TFactor<double> *)local_138,(VarSet *)&local_178,&local_158);
    TFactor<double>::operator*=(&local_80,(TFactor<double> *)local_138);
    if (local_118 != (pointer)0x0) {
      operator_delete(local_118,(long)local_108 - (long)local_118);
    }
    if ((pointer)local_138._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_138._0_8_,local_138._16_8_ - local_138._0_8_);
    }
    if (local_178._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_178._M_dataplus._M_p,
                      local_178.field_2._M_allocated_capacity - (long)local_178._M_dataplus._M_p);
    }
    if (local_158._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_158._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_158._p.super__Vector_base<double,_std::allocator<double>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage -
                      (long)local_158._p.super__Vector_base<double,_std::allocator<double>_>._M_impl
                            .super__Vector_impl_data._M_start);
    }
    local_180 = local_180 + 1;
  } while( true );
}

Assistant:

Factor TRW::beliefF (size_t I) const {
        VarSet v_I = grm().factor(I).vars();
        
        Factor prod;
        if( v_I.size() == 1 )
            ;
        else if( v_I.size() == 2 ) {
            Var v_i = *(v_I.begin());
            Var v_j = *((v_I / v_i).begin());
            size_t i = grm().findVar(v_i);
            size_t j = grm().findVar(v_j);
            prod = grm().factor(I)^(1.0 / rho(i,j));
        } else
            DAI_THROW(NOT_IMPLEMENTED);

        for( FactorGraph::nb_cit i = grm().nbF(I).begin(); i != grm().nbF(I).end(); i++ ) {
            Var v_i = grm().var( *i );
            Prob prod_i( v_i.states() );

            for( FactorGraph::nb_cit J = grm().nbV(*i).begin(); J != grm().nbV(*i).end(); J++ ) {
                VarSet v_J = grm().factor(*J).vars();
                if( v_J.size() == 1 ) {
                    prod_i *= newMessage(*i,*J);
                } else if( v_J.size() == 2 ) {
                    Var v_k = *((v_J / v_i).begin());
                    size_t k = grm().findVar(v_k);
                    if( *J != I )
                        prod_i *= newMessage(*i,*J)^rho(*i,k);
                    else
                        prod_i *= newMessage(*i,*J)^(rho(*i,k) - 1.0);
                } else
                    DAI_THROW(NOT_IMPLEMENTED);
            }

            prod *= Factor( v_i, prod_i );
        }

        return prod.normalized();
    }